

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void amrex::ParmParse::dumpTable(ostream *os,bool prettyPrint)

{
  ostream *poVar1;
  undefined8 *puVar2;
  string sStack_48;
  
  puVar2 = &(anonymous_namespace)::g_table_abi_cxx11_;
  while (puVar2 = (undefined8 *)*puVar2, puVar2 != &(anonymous_namespace)::g_table_abi_cxx11_) {
    if ((prettyPrint) && (*(char *)(puVar2 + 10) == '\x01')) {
      PP_entry::print_abi_cxx11_(&sStack_48,(PP_entry *)(puVar2 + 2));
      poVar1 = std::operator<<(os,(string *)&sStack_48);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    else {
      amrex::operator<<(os,(PP_entry *)(puVar2 + 2));
      std::endl<char,std::char_traits<char>>(os);
    }
  }
  return;
}

Assistant:

void
ParmParse::dumpTable (std::ostream& os, bool prettyPrint)
{
    for ( const_list_iterator li = g_table.begin(), End = g_table.end(); li != End; ++li )
    {
        if(prettyPrint && li->m_queried) {
            os << li->print() << std::endl;
        }
        else
            os << *li << std::endl;
    }
}